

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

void __thiscall
llm_graph_context::build_pooling
          (llm_graph_context *this,ggml_cgraph *gf,ggml_tensor *cls,ggml_tensor *cls_b,
          ggml_tensor *cls_out,ggml_tensor *cls_out_b)

{
  pointer plVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ggml_tensor *pgVar4;
  undefined8 uVar5;
  ggml_tensor *pgVar6;
  long in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  ggml_tensor *inp_cls_1;
  ggml_tensor *inp_cls;
  ggml_tensor *inp_mean;
  ggml_tensor *cur;
  ggml_tensor *inp;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  ggml_tensor *in_stack_ffffffffffffff78;
  llm_graph_context *in_stack_ffffffffffffff80;
  llm_graph_context *in_stack_ffffffffffffffc0;
  
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x38) & 1) != 0) {
    plVar1 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                       ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                        0x43766b);
    pgVar6 = plVar1->t_embd;
    if (pgVar6 == (ggml_tensor *)0x0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x67b,"GGML_ASSERT(%s) failed",
                 "inp != nullptr && \"missing result_norm/result_embd tensor\"");
    }
    switch(*(undefined4 *)(in_RDI + 0xb4)) {
    case 0:
      break;
    case 1:
      pgVar4 = build_inp_mean(in_stack_ffffffffffffffc0);
      uVar5 = *(undefined8 *)(in_RDI + 0xc0);
      uVar3 = *(undefined8 *)(in_RDI + 0xc0);
      uVar2 = ggml_transpose(*(undefined8 *)(in_RDI + 0xc0),pgVar6);
      uVar3 = ggml_cont(uVar3,uVar2);
      pgVar6 = (ggml_tensor *)ggml_mul_mat(uVar5,uVar3,pgVar4);
      break;
    case 2:
    case 3:
      pgVar4 = build_inp_cls(in_stack_ffffffffffffffc0);
      pgVar6 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar6,pgVar4);
      break;
    case 4:
      pgVar4 = build_inp_cls(in_stack_ffffffffffffffc0);
      uVar5 = ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar6,pgVar4);
      if (in_RDX == 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,0x696,"GGML_ASSERT(%s) failed","cls != nullptr");
      }
      if (in_RCX == 0) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                   ,0x697,"GGML_ASSERT(%s) failed","cls_b != nullptr");
      }
      in_stack_ffffffffffffff80 = *(llm_graph_context **)(in_RDI + 0xc0);
      uVar5 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xc0),in_RDX,uVar5);
      uVar5 = ggml_add(in_stack_ffffffffffffff80,uVar5,in_RCX);
      pgVar6 = (ggml_tensor *)ggml_tanh(*(undefined8 *)(in_RDI + 0xc0),uVar5);
      if (in_R8 != 0) {
        if (in_R9 == 0) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                     ,0x69f,"GGML_ASSERT(%s) failed","cls_out_b != nullptr");
        }
        in_stack_ffffffffffffff78 = *(ggml_tensor **)(in_RDI + 0xc0);
        uVar5 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xc0),in_R8,pgVar6);
        pgVar6 = (ggml_tensor *)ggml_add(in_stack_ffffffffffffff78,uVar5,in_R9);
      }
      break;
    default:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x6a6,"unknown pooling type");
    }
    cb(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
       in_stack_ffffffffffffff6c);
    pgVar4 = pgVar6;
    plVar1 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                       ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                        0x437922);
    plVar1->t_embd_pooled = pgVar6;
    ggml_build_forward_expand(in_RSI,pgVar4);
  }
  return;
}

Assistant:

void llm_graph_context::build_pooling(
        ggml_cgraph * gf,
        ggml_tensor * cls,
        ggml_tensor * cls_b,
        ggml_tensor * cls_out,
        ggml_tensor * cls_out_b) const {
    if (!cparams.embeddings) {
        return;
    }

    ggml_tensor * inp = res->t_embd;

    //// find result_norm tensor for input
    //for (int i = ggml_graph_n_nodes(gf) - 1; i >= 0; --i) {
    //    inp = ggml_graph_node(gf, i);
    //    if (strcmp(inp->name, "result_norm") == 0 || strcmp(inp->name, "result_embd") == 0) {
    //        break;
    //    }

    //    inp = nullptr;
    //}

    GGML_ASSERT(inp != nullptr && "missing result_norm/result_embd tensor");

    ggml_tensor * cur;

    switch (pooling_type) {
        case LLAMA_POOLING_TYPE_NONE:
            {
                cur = inp;
            } break;
        case LLAMA_POOLING_TYPE_MEAN:
            {
                ggml_tensor * inp_mean = build_inp_mean();
                cur = ggml_mul_mat(ctx0, ggml_cont(ctx0, ggml_transpose(ctx0, inp)), inp_mean);
            } break;
        case LLAMA_POOLING_TYPE_CLS:
        case LLAMA_POOLING_TYPE_LAST:
            {
                ggml_tensor * inp_cls = build_inp_cls();
                cur = ggml_get_rows(ctx0, inp, inp_cls);
            } break;
        case LLAMA_POOLING_TYPE_RANK:
            {
                ggml_tensor * inp_cls = build_inp_cls();
                inp = ggml_get_rows(ctx0, inp, inp_cls);

                // classification head
                // https://github.com/huggingface/transformers/blob/5af7d41e49bbfc8319f462eb45253dcb3863dfb7/src/transformers/models/roberta/modeling_roberta.py#L1566
                GGML_ASSERT(cls   != nullptr);
                GGML_ASSERT(cls_b != nullptr);

                cur = ggml_add (ctx0, ggml_mul_mat(ctx0, cls, inp), cls_b);
                cur = ggml_tanh(ctx0, cur);

                // some models don't have `cls_out`, for example: https://huggingface.co/jinaai/jina-reranker-v1-tiny-en
                // https://huggingface.co/jinaai/jina-reranker-v1-tiny-en/blob/cb5347e43979c3084a890e3f99491952603ae1b7/modeling_bert.py#L884-L896
                if (cls_out) {
                    GGML_ASSERT(cls_out_b != nullptr);

                    cur = ggml_add (ctx0, ggml_mul_mat(ctx0, cls_out, cur), cls_out_b);
                }
            } break;
        default:
            {
                GGML_ABORT("unknown pooling type");
            }
    }

    cb(cur, "result_embd_pooled", -1);
    res->t_embd_pooled = cur;

    ggml_build_forward_expand(gf, cur);
}